

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stbfile * stb_open(char *filename,char *mode)

{
  FILE *pFVar1;
  stbfile *psVar2;
  long lVar3;
  undefined **ppuVar4;
  stbfile *psVar5;
  byte bVar6;
  
  bVar6 = 0;
  pFVar1 = stb_fopen(filename,mode + (*mode == 'k'));
  if ((pFVar1 != (FILE *)0x0) && (psVar2 = (stbfile *)malloc(0x68), psVar2 != (stbfile *)0x0)) {
    ppuVar4 = &PTR_stb__fgetbyte_001c9c18;
    psVar5 = psVar2;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      psVar5->getbyte = (_func_int_stbfile_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      psVar5 = (stbfile *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    psVar2->f = pFVar1;
    psVar2->close = stb__fclose2;
    (psVar2->field_12).various = (*mode == 'k') + 1;
    return psVar2;
  }
  return (stbfile *)0x0;
}

Assistant:

stbfile *stb_open(char *filename, char *mode)
{
   FILE *f = stb_fopen(filename, mode[0] == 'k' ? mode+1 : mode);
   stbfile *s;
   if (f == NULL) return NULL;
   s = stb_openf(f);
   if (s) {
      s->close = stb__fclose2;
      s->various = mode[0] == 'k' ? stb_keep_if_different : stb_keep_yes;
   }
   return s;
}